

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

bool ImGui_ImplOpenGL3_Init(char *glsl_version)

{
  GLubyte *pGVar1;
  ImGuiIO *pIVar2;
  size_t sVar3;
  char *__s;
  GLint minor;
  GLint major;
  GLint current_texture;
  GLint local_2c;
  GLint local_28;
  GLint local_24;
  
  local_28 = 0;
  local_2c = 0;
  (*gl3wGetIntegerv)(0x821b,&local_28);
  (*gl3wGetIntegerv)(0x821c,&local_2c);
  if (local_2c == 0 && local_28 == 0) {
    pGVar1 = (*gl3wGetString)(0x1f02);
    __isoc99_sscanf(pGVar1,"%d.%d",&local_28,&local_2c);
  }
  g_GlVersion = local_2c * 10 + local_28 * 100;
  pIVar2 = ImGui::GetIO();
  pIVar2->BackendRendererName = "imgui_impl_opengl3";
  if (0x13f < g_GlVersion) {
    *(byte *)&pIVar2->BackendFlags = (byte)pIVar2->BackendFlags | 8;
  }
  __s = "#version 130";
  if (glsl_version != (char *)0x0) {
    __s = glsl_version;
  }
  sVar3 = strlen(__s);
  if ((int)sVar3 < 0x1e) {
    strcpy(g_GlslVersionString,__s);
    sVar3 = strlen(g_GlslVersionString);
    (g_GlslVersionString + sVar3)[0] = '\n';
    (g_GlslVersionString + sVar3)[1] = '\0';
    (*gl3wGetIntegerv)(0x8069,&local_24);
    return true;
  }
  __assert_fail("(int)strlen(glsl_version) + 2 < ((int)(sizeof(g_GlslVersionString) / sizeof(*(g_GlslVersionString))))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/backends/imgui_impl_opengl3.cpp"
                ,0xc4,"bool ImGui_ImplOpenGL3_Init(const char *)");
}

Assistant:

bool    ImGui_ImplOpenGL3_Init(const char* glsl_version)
{
    // Query for GL version (e.g. 320 for GL 3.2)
#if !defined(IMGUI_IMPL_OPENGL_ES2)
    GLint major = 0;
    GLint minor = 0;
    glGetIntegerv(GL_MAJOR_VERSION, &major);
    glGetIntegerv(GL_MINOR_VERSION, &minor);
    if (major == 0 && minor == 0)
    {
        // Query GL_VERSION in desktop GL 2.x, the string will start with "<major>.<minor>"
        const char* gl_version = (const char*)glGetString(GL_VERSION);
        sscanf(gl_version, "%d.%d", &major, &minor);
    }
    g_GlVersion = (GLuint)(major * 100 + minor * 10);
#else
    g_GlVersion = 200; // GLES 2
#endif

    // Setup backend capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendRendererName = "imgui_impl_opengl3";
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
    if (g_GlVersion >= 320)
        io.BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;  // We can honor the ImDrawCmd::VtxOffset field, allowing for large meshes.
#endif

    // Store GLSL version string so we can refer to it later in case we recreate shaders.
    // Note: GLSL version is NOT the same as GL version. Leave this to NULL if unsure.
#if defined(IMGUI_IMPL_OPENGL_ES2)
    if (glsl_version == NULL)
        glsl_version = "#version 100";
#elif defined(IMGUI_IMPL_OPENGL_ES3)
    if (glsl_version == NULL)
        glsl_version = "#version 300 es";
#elif defined(__APPLE__)
    if (glsl_version == NULL)
        glsl_version = "#version 150";
#else
    if (glsl_version == NULL)
        glsl_version = "#version 130";
#endif
    IM_ASSERT((int)strlen(glsl_version) + 2 < IM_ARRAYSIZE(g_GlslVersionString));
    strcpy(g_GlslVersionString, glsl_version);
    strcat(g_GlslVersionString, "\n");

    // Debugging construct to make it easily visible in the IDE and debugger which GL loader has been selected.
    // The code actually never uses the 'gl_loader' variable! It is only here so you can read it!
    // If auto-detection fails or doesn't select the same GL loader file as used by your application,
    // you are likely to get a crash below.
    // You can explicitly select a loader by using '#define IMGUI_IMPL_OPENGL_LOADER_XXX' in imconfig.h or compiler command-line.
    const char* gl_loader = "Unknown";
    IM_UNUSED(gl_loader);
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
    gl_loader = "GL3W";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
    gl_loader = "GLEW";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
    gl_loader = "GLAD";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD2)
    gl_loader = "GLAD2";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLBINDING2)
    gl_loader = "glbinding2";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLBINDING3)
    gl_loader = "glbinding3";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_CUSTOM)
    gl_loader = "custom";
#else
    gl_loader = "none";
#endif

    // Make an arbitrary GL call (we don't actually need the result)
    // IF YOU GET A CRASH HERE: it probably means that you haven't initialized the OpenGL function loader used by this code.
    // Desktop OpenGL 3/4 need a function loader. See the IMGUI_IMPL_OPENGL_LOADER_xxx explanation above.
    GLint current_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &current_texture);

    return true;
}